

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O3

CharClass<wchar_t> * __thiscall
Centaurus::CharClass<wchar_t>::operator|
          (CharClass<wchar_t> *__return_storage_ptr__,CharClass<wchar_t> *this,Range<wchar_t> *r)

{
  vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_> *this_00;
  wchar_t wVar1;
  wchar_t wVar2;
  pointer pRVar3;
  pointer pRVar4;
  ulong uVar5;
  wchar_t wVar6;
  ulong uVar7;
  pointer pRVar8;
  
  CharClass(__return_storage_ptr__);
  pRVar3 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar4 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar8 = pRVar3;
  if (pRVar3 != pRVar4) {
    do {
      if ((pRVar8->m_start <= r->m_end) && (r->m_start <= pRVar8->m_end)) break;
      pRVar8 = pRVar8 + 1;
    } while (pRVar8 != pRVar4);
  }
  this_00 = &__return_storage_ptr__->m_ranges;
  std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Centaurus::Range<wchar_t>const*,std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>>>
            ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)this_00,
             (__return_storage_ptr__->m_ranges).
             super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,pRVar3,pRVar8);
  if (pRVar8 != (this->m_ranges).
                super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar5 = (ulong)(uint)r->m_start;
    wVar6 = r->m_end;
    do {
      wVar1 = pRVar8->m_start;
      if (wVar6 < wVar1) break;
      wVar2 = pRVar8->m_end;
      if (wVar2 < (wchar_t)uVar5) break;
      if (wVar1 < (wchar_t)uVar5) {
        uVar5 = (ulong)(uint)wVar1;
      }
      if (wVar2 < wVar6) {
        wVar2 = wVar6;
      }
      wVar6 = wVar2;
      pRVar8 = pRVar8 + 1;
      uVar7 = (ulong)(uint)wVar6 << 0x20 | uVar5;
      r->m_start = (int)uVar7;
      r->m_end = (int)(uVar7 >> 0x20);
    } while (pRVar8 != (this->m_ranges).
                       super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::push_back
            (this_00,r);
  std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<Centaurus::Range<wchar_t>const*,std::vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>>>>
            ((vector<Centaurus::Range<wchar_t>,std::allocator<Centaurus::Range<wchar_t>>> *)this_00,
             (__return_storage_ptr__->m_ranges).
             super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,pRVar8,
             (this->m_ranges).
             super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  return __return_storage_ptr__;
}

Assistant:

CharClass<TCHAR> operator|(Range<TCHAR> r) const
    {
        CharClass<TCHAR> cc;

        auto i = m_ranges.cbegin();

        for (; i != m_ranges.cend() && !i->overlaps(r); i++)
            ;
        
        cc.m_ranges.insert(cc.m_ranges.end(), m_ranges.cbegin(), i);

        for (; i != m_ranges.cend() && i->overlaps(r); i++)
        {
            r = r.merge(*i);
        }

        cc.m_ranges.push_back(r);

        cc.m_ranges.insert(cc.m_ranges.end(), i, m_ranges.cend());

        return cc;
    }